

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

void require_boolean_datatype(Context_conflict *ctx,MOJOSHADER_astDataType *datatype)

{
  MOJOSHADER_astDataType *pMVar1;
  MOJOSHADER_astDataType *datatype_local;
  Context_conflict *ctx_local;
  
  pMVar1 = reduce_datatype(ctx,datatype);
  if (2 < pMVar1->type - MOJOSHADER_AST_DATATYPE_BOOL) {
    fail(ctx,"Expected boolean type");
  }
  return;
}

Assistant:

static void require_boolean_datatype(Context *ctx,
                                     const MOJOSHADER_astDataType *datatype)
{
    datatype = reduce_datatype(ctx, datatype);
    switch (datatype->type)
    {
        case MOJOSHADER_AST_DATATYPE_BOOL:
        case MOJOSHADER_AST_DATATYPE_INT:
        case MOJOSHADER_AST_DATATYPE_UINT:
            return;
        default: break;
    } // switch

    fail(ctx, "Expected boolean type");  // !!! FIXME: fmt.
    // !!! FIXME: replace AST node with an AST_OP_BOOLEAN_LITERAL false, keep going.
}